

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_write(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  mbedtls_ssl_config *pmVar3;
  int iVar4;
  
  iVar4 = -0x7100;
  iVar2 = iVar4;
  if (((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) &&
     (iVar2 = ssl_check_ctr_renegotiate(ssl), iVar2 == 0)) {
    pmVar3 = ssl->conf;
    if (ssl->state == 0x10) {
LAB_00116842:
      if (((len < 2) || ((*(uint *)&pmVar3->field_0x174 & 0x2000) == 0)) ||
         ((1 < ssl->minor_ver ||
          ((pmVar1 = (ssl->transform_out->cipher_ctx_enc).cipher_info,
           pmVar1 == (mbedtls_cipher_info_t *)0x0 || (pmVar1->mode != MBEDTLS_MODE_CBC)))))) {
        iVar2 = ssl_write_real(ssl,buf,len);
        return iVar2;
      }
      if (ssl->split_done == '\0') {
        iVar2 = ssl_write_real(ssl,buf,1);
        if (iVar2 < 1) {
          return iVar2;
        }
        ssl->split_done = '\x01';
      }
      iVar2 = ssl_write_real(ssl,buf + 1,len - 1);
      if (0 < iVar2) {
        ssl->split_done = '\0';
        iVar2 = iVar2 + 1;
      }
    }
    else {
      iVar2 = iVar4;
      if (pmVar3 != (mbedtls_ssl_config *)0x0) {
        do {
          if (ssl->state == 0x10) {
            pmVar3 = ssl->conf;
            goto LAB_00116842;
          }
          iVar2 = mbedtls_ssl_handshake_step(ssl);
        } while (iVar2 == 0);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_write( mbedtls_ssl_context *ssl, const unsigned char *buf, size_t len )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write" ) );

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ( ret = ssl_check_ctr_renegotiate( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "ssl_check_ctr_renegotiate", ret );
        return( ret );
    }
#endif

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        if( ( ret = mbedtls_ssl_handshake( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_handshake", ret );
            return( ret );
        }
    }

#if defined(MBEDTLS_SSL_CBC_RECORD_SPLITTING)
    ret = ssl_write_split( ssl, buf, len );
#else
    ret = ssl_write_real( ssl, buf, len );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write" ) );

    return( ret );
}